

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

char * cppcms_capi_error_message(cppcms_capi_object obj)

{
  char *pcVar1;
  
  pcVar1 = "ok";
  if ((obj != (cppcms_capi_object)0x0) && (*obj != 0)) {
    pcVar1 = *(char **)((long)obj + 8);
  }
  return pcVar1;
}

Assistant:

char const *cppcms_capi_error_message(cppcms_capi_object obj)
{
	if(!obj)
		return "ok";
	cppcms_capi_exception *e=static_cast<cppcms_capi_exception *>(obj);
	if(e->code == 0)
		return "ok";
	else
		return e->msg;
}